

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall ftxui::ComponentBase::Add(ComponentBase *this,Component *child)

{
  Detach((child->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  ((child->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->parent_ =
       this;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>
  ::emplace_back<std::shared_ptr<ftxui::ComponentBase>>
            ((vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>
              *)&this->children_,child);
  return;
}

Assistant:

void ComponentBase::Add(Component child) {
  child->Detach();
  child->parent_ = this;
  children_.push_back(std::move(child));
}